

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O3

void test_bson_visit_unsupported_type(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined5 *puVar4;
  undefined5 *puVar5;
  undefined8 *puVar6;
  unsupported_type_test_data_t context;
  char data [13];
  bson_iter_t iter;
  bson_t b;
  bson_visitor_t visitor;
  undefined4 uStack_c60;
  undefined4 uStack_c5c;
  undefined4 uStack_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined8 uStack_c40;
  undefined8 uStack_c38;
  undefined4 uStack_c30;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined4 uStack_c10;
  undefined1 auStack_c00 [192];
  undefined8 uStack_b40;
  undefined8 uStack_b38;
  undefined4 uStack_b30;
  undefined8 *puStack_a98;
  undefined1 *puStack_a90;
  code *pcStack_a88;
  undefined8 uStack_a30;
  char *pcStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a10;
  undefined4 uStack_a08;
  undefined8 auStack_a00 [16];
  undefined1 auStack_980 [224];
  undefined1 auStack_8a0 [184];
  code *pcStack_7e8;
  undefined5 *puStack_718;
  undefined1 *puStack_710;
  code *apcStack_708 [11];
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined5 uStack_690;
  undefined3 uStack_68b;
  undefined5 uStack_688;
  undefined5 auStack_680 [16];
  undefined1 auStack_600 [224];
  undefined1 auStack_520 [184];
  code *pcStack_468;
  undefined5 *puStack_398;
  undefined1 *puStack_390;
  code *apcStack_388 [11];
  undefined8 local_330;
  char *pcStack_328;
  undefined8 local_320;
  undefined5 local_310;
  undefined3 uStack_30b;
  undefined5 uStack_308;
  undefined5 local_300 [16];
  undefined1 local_280 [224];
  undefined1 local_1a0 [184];
  code *local_e8;
  
  puVar4 = &local_310;
  local_310 = 0x330000000c;
  uStack_30b = 0x1006b;
  uStack_308 = 0;
  local_330 = 0;
  pcStack_328 = (char *)0x0;
  local_320 = 0;
  apcStack_388[0] = (code *)0x1266ca;
  memset(local_1a0,0,0x100);
  local_e8 = visit_unsupported_type;
  apcStack_388[0] = (code *)0x1266ed;
  cVar1 = bson_init_static(local_280,puVar4,0xc);
  if (cVar1 == '\0') {
    apcStack_388[0] = (code *)0x12675f;
    test_bson_visit_unsupported_type_cold_1();
LAB_0012675f:
    apcStack_388[0] = (code *)0x126764;
    test_bson_visit_unsupported_type_cold_2();
LAB_00126764:
    apcStack_388[0] = (code *)0x126769;
    test_bson_visit_unsupported_type_cold_6();
LAB_00126769:
    apcStack_388[0] = (code *)0x12676e;
    test_bson_visit_unsupported_type_cold_3();
LAB_0012676e:
    apcStack_388[0] = (code *)0x126773;
    test_bson_visit_unsupported_type_cold_4();
  }
  else {
    apcStack_388[0] = (code *)0x126706;
    cVar1 = bson_iter_init(local_300);
    if (cVar1 == '\0') goto LAB_0012675f;
    puVar4 = local_300;
    apcStack_388[0] = (code *)0x126727;
    bson_iter_visit_all(puVar4,local_1a0,&local_330);
    apcStack_388[0] = (code *)0x12672f;
    cVar1 = bson_iter_next(puVar4);
    if (cVar1 != '\0') goto LAB_00126764;
    if ((char)local_330 == '\0') goto LAB_00126769;
    if ((*pcStack_328 != 'k') || (pcStack_328[1] != '\0')) goto LAB_0012676e;
    if ((int)local_320 == 0x33) {
      return;
    }
  }
  apcStack_388[0] = test_bson_visit_unsupported_type_bad_key;
  test_bson_visit_unsupported_type_cold_5();
  puVar5 = &uStack_690;
  uStack_690 = 0x330000000c;
  uStack_68b = 0x10080;
  uStack_688 = 0;
  uStack_6b0 = 0;
  uStack_6a8 = 0;
  uStack_6a0 = 0;
  apcStack_708[0] = (code *)0x1267cc;
  puStack_398 = puVar4;
  puStack_390 = local_1a0;
  apcStack_388[0] = (code *)&stack0xfffffffffffffff8;
  memset(auStack_520,0,0x100);
  pcStack_468 = visit_unsupported_type;
  apcStack_708[0] = (code *)0x1267ef;
  cVar1 = bson_init_static(auStack_600,puVar5,0xc);
  if (cVar1 == '\0') {
    apcStack_708[0] = (code *)0x12684a;
    test_bson_visit_unsupported_type_bad_key_cold_1();
LAB_0012684a:
    apcStack_708[0] = (code *)0x12684f;
    test_bson_visit_unsupported_type_bad_key_cold_2();
LAB_0012684f:
    apcStack_708[0] = (code *)0x126854;
    test_bson_visit_unsupported_type_bad_key_cold_4();
  }
  else {
    apcStack_708[0] = (code *)0x126808;
    cVar1 = bson_iter_init(auStack_680);
    if (cVar1 == '\0') goto LAB_0012684a;
    puVar5 = auStack_680;
    apcStack_708[0] = (code *)0x126829;
    bson_iter_visit_all(puVar5,auStack_520,&uStack_6b0);
    apcStack_708[0] = (code *)0x126831;
    cVar1 = bson_iter_next(puVar5);
    if (cVar1 != '\0') goto LAB_0012684f;
    if ((char)uStack_6b0 != '\x01') {
      return;
    }
  }
  apcStack_708[0] = test_bson_visit_unsupported_type_empty_key;
  test_bson_visit_unsupported_type_bad_key_cold_3();
  puVar6 = &uStack_a10;
  uStack_a10 = 0x100330000000b;
  uStack_a08 = 0;
  uStack_a30 = 0;
  pcStack_a28 = (char *)0x0;
  uStack_a20 = 0;
  pcStack_a88 = (code *)0x1268ac;
  puStack_718 = puVar5;
  puStack_710 = auStack_520;
  apcStack_708[0] = (code *)apcStack_388;
  memset(auStack_8a0,0,0x100);
  pcStack_7e8 = visit_unsupported_type;
  pcStack_a88 = (code *)0x1268cf;
  cVar1 = bson_init_static(auStack_980,puVar6,0xb);
  if (cVar1 == '\0') {
    pcStack_a88 = (code *)0x12693b;
    test_bson_visit_unsupported_type_empty_key_cold_1();
LAB_0012693b:
    pcStack_a88 = (code *)0x126940;
    test_bson_visit_unsupported_type_empty_key_cold_2();
LAB_00126940:
    pcStack_a88 = (code *)0x126945;
    test_bson_visit_unsupported_type_empty_key_cold_6();
LAB_00126945:
    pcStack_a88 = (code *)0x12694a;
    test_bson_visit_unsupported_type_empty_key_cold_3();
LAB_0012694a:
    pcStack_a88 = (code *)0x12694f;
    test_bson_visit_unsupported_type_empty_key_cold_4();
  }
  else {
    pcStack_a88 = (code *)0x1268e8;
    cVar1 = bson_iter_init(auStack_a00,auStack_980);
    if (cVar1 == '\0') goto LAB_0012693b;
    puVar6 = auStack_a00;
    pcStack_a88 = (code *)0x126909;
    bson_iter_visit_all(puVar6,auStack_8a0,&uStack_a30);
    pcStack_a88 = (code *)0x126911;
    cVar1 = bson_iter_next(puVar6);
    if (cVar1 != '\0') goto LAB_00126940;
    if ((char)uStack_a30 == '\0') goto LAB_00126945;
    if (*pcStack_a28 != '\0') goto LAB_0012694a;
    if ((int)uStack_a20 == 0x33) {
      return;
    }
  }
  pcStack_a88 = test_bson_subtype_2;
  test_bson_visit_unsupported_type_empty_key_cold_5();
  uStack_b40 = 0x600780500000013;
  uStack_b38 = 0x202000000;
  uStack_b30 = 0xffff;
  uStack_c20 = 0x600780500000013;
  uStack_c18 = 0x302000000;
  uStack_c10 = 0xffff;
  uStack_c40 = 0x600780500000013;
  uStack_c38 = 0x102000000;
  uStack_c30 = 0xffff;
  uStack_c60 = 0x13;
  uStack_c5c = 0x6007805;
  uStack_c58 = 0x2000000;
  uStack_c54 = 0xffffffff;
  uStack_c50 = 0xffff;
  puStack_a98 = puVar6;
  puStack_a90 = auStack_8a0;
  pcStack_a88 = (code *)apcStack_708;
  uVar3 = bson_bcon_magic();
  uVar3 = bcon_new(0,"x",uVar3,4,2,anon_var_dwarf_549c,2,0);
  cVar1 = bson_init_static(auStack_c00,&uStack_b40,0x13);
  if (cVar1 == '\0') {
    test_bson_subtype_2_cold_1();
LAB_00126ae3:
    test_bson_subtype_2_cold_2();
LAB_00126ae8:
    test_bson_subtype_2_cold_3();
LAB_00126aed:
    test_bson_subtype_2_cold_4();
LAB_00126af2:
    test_bson_subtype_2_cold_9();
LAB_00126af7:
    test_bson_subtype_2_cold_5();
LAB_00126afc:
    test_bson_subtype_2_cold_8();
  }
  else {
    cVar1 = bson_validate(auStack_c00,0,0);
    if (cVar1 == '\0') goto LAB_00126ae3;
    iVar2 = bson_compare(auStack_c00,uVar3);
    if (iVar2 != 0) goto LAB_00126ae8;
    cVar1 = bson_init_static(auStack_c00,&uStack_c20,0x13);
    if (cVar1 == '\0') goto LAB_00126aed;
    cVar1 = bson_validate(auStack_c00,0,0);
    if (cVar1 != '\0') goto LAB_00126af2;
    cVar1 = bson_init_static(auStack_c00,&uStack_c40,0x13);
    if (cVar1 == '\0') goto LAB_00126af7;
    cVar1 = bson_validate(auStack_c00,0,0);
    if (cVar1 != '\0') goto LAB_00126afc;
    cVar1 = bson_init_static(auStack_c00,&uStack_c60,0x13);
    if (cVar1 != '\0') {
      cVar1 = bson_validate(auStack_c00,0,0);
      if (cVar1 == '\0') {
        bson_destroy(uVar3);
        return;
      }
      goto LAB_00126b06;
    }
  }
  test_bson_subtype_2_cold_6();
LAB_00126b06:
  test_bson_subtype_2_cold_7();
  return;
}

Assistant:

static void
test_bson_visit_unsupported_type (void)
{
   /* {k: 1}, but instead of BSON type 0x10 (int32), use unknown type 0x33 */
   const char data[] = "\x0c\x00\x00\x00\x33k\x00\x01\x00\x00\x00\x00";
   bson_t b;
   bson_iter_t iter;
   unsupported_type_test_data_t context = {0};
   bson_visitor_t visitor = {0};

   visitor.visit_unsupported_type = visit_unsupported_type;

   BSON_ASSERT (bson_init_static (&b, (const uint8_t *) data, sizeof data - 1));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   bson_iter_visit_all (&iter, &visitor, (void *) &context);
   BSON_ASSERT (!bson_iter_next (&iter));
   BSON_ASSERT (context.visited);
   BSON_ASSERT (!strcmp (context.key, "k"));
   BSON_ASSERT (context.type_code == '\x33');
}